

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

Internal * __thiscall
stackjit::Runtime::Internal::valueToString_abi_cxx11_(Internal *this,RegisterValue value,Type *type)

{
  __type _Var1;
  uint uVar2;
  ostream *this_00;
  void *pvVar3;
  string *__lhs;
  string local_220 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200 [32];
  float local_1e0;
  float local_1dc;
  float floatValue;
  int floatPattern;
  stringstream local_1a8 [8];
  stringstream stringstream;
  ostream local_198 [376];
  Type *local_20;
  Type *type_local;
  RegisterValue value_local;
  
  local_20 = type;
  type_local = (Type *)value;
  value_local = (RegisterValue)this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  uVar2 = (*local_20->_vptr_Type[2])();
  if ((uVar2 & 1) == 0) {
    __lhs = Type::name_abi_cxx11_(local_20);
    TypeSystem::toString_abi_cxx11_((TypeSystem *)&floatValue,Float);
    _Var1 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&floatValue);
    std::__cxx11::string::~string((string *)&floatValue);
    if (_Var1) {
      local_1dc = type_local._0_4_;
      local_1e0 = type_local._0_4_;
      std::ostream::operator<<(local_198,type_local._0_4_);
    }
    else {
      std::ostream::operator<<(local_198,(long)type_local);
    }
  }
  else if (type_local == (Type *)0x0) {
    std::operator<<(local_198,"nullref");
  }
  else {
    this_00 = std::operator<<(local_198,"0x");
    pvVar3 = (void *)std::ostream::operator<<(this_00,std::hex);
    pvVar3 = (void *)std::ostream::operator<<(pvVar3,(long)type_local);
    std::ostream::operator<<(pvVar3,std::dec);
  }
  Type::name_abi_cxx11_(local_20);
  std::operator+((char *)local_220,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x25ed26);
  std::operator+(local_200,(char *)local_220);
  std::operator<<(local_198,(string *)local_200);
  std::__cxx11::string::~string((string *)local_200);
  std::__cxx11::string::~string(local_220);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return this;
}

Assistant:

std::string Runtime::Internal::valueToString(RegisterValue value, const Type* type) {
		std::stringstream stringstream;
		if (type->isReference()) {
			if (value == 0) {
				stringstream<< "nullref";
			} else {
				stringstream << "0x" << std::hex << value << std::dec;
			}
		} else if (type->name() == TypeSystem::toString(PrimitiveTypes::Float)) {
			int floatPattern = (int)value;
			float floatValue = *(reinterpret_cast<float*>(&floatPattern));
			stringstream << floatValue;
		} else {
			stringstream << value;
		}

		stringstream << " (" + type->name() + ")";
		return stringstream.str();
	}